

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O1

propery * booster::locale::impl::ios_prop<propery>::get(ios_base *ios)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  undefined8 *puVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  uVar2 = get_id();
  bVar1 = has(ios);
  if (!bVar1) {
    uStack_18 = CONCAT44(0xffffffff,(undefined4)uStack_18);
    counter = counter + 1;
    set((propery *)((long)&uStack_18 + 4),ios);
    counter = counter + -1;
  }
  if (uVar2 < *(uint *)(ios + 0xc0)) {
    puVar3 = (undefined8 *)((long)(int)uVar2 * 0x10 + *(long *)(ios + 200));
  }
  else {
    puVar3 = (undefined8 *)std::ios_base::_M_grow_words((int)ios,SUB41(uVar2,0));
  }
  return (propery *)*puVar3;
}

Assistant:

static Property &get(std::ios_base &ios)
                {
                    int id=get_id();
                    if(!has(ios))
                        set(Property(),ios);
                    return *static_cast<Property *>(ios.pword(id));
                }